

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<(anonymous_namespace)::Constructable>::
emplaceRealloc<(anonymous_namespace)::Constructable_const&>
          (SmallVectorBase<(anonymous_namespace)::Constructable> *this,pointer pos,
          Constructable *args)

{
  ulong uVar1;
  pointer pCVar2;
  Constructable *__result;
  Constructable *__result_00;
  ulong uVar3;
  Constructable *__last;
  Constructable *__first;
  Constructable *this_00;
  
  if (this->len == 0xfffffffffffffff) {
    detail::throwLengthError();
  }
  uVar3 = this->len + 1;
  uVar1 = this->cap;
  if (uVar3 < uVar1 * 2) {
    uVar3 = uVar1 * 2;
  }
  if (0xfffffffffffffff - uVar1 < uVar1) {
    uVar3 = 0xfffffffffffffff;
  }
  pCVar2 = this->data_;
  __result = (Constructable *)operator_new(uVar3 * 8);
  this_00 = (Constructable *)(((long)pos - (long)pCVar2) + (long)__result);
  anon_unknown.dwarf_965823::Constructable::Constructable(this_00,args);
  __first = this->data_;
  __last = __first + this->len;
  __result_00 = __result;
  if (__last != pos) {
    std::
    uninitialized_move<(anonymous_namespace)::Constructable*,(anonymous_namespace)::Constructable*>
              (__first,pos,__result);
    __last = this->data_ + this->len;
    __result_00 = this_00 + 1;
    __first = pos;
  }
  std::
  uninitialized_move<(anonymous_namespace)::Constructable*,(anonymous_namespace)::Constructable*>
            (__first,__last,__result_00);
  cleanup(this,(EVP_PKEY_CTX *)__last);
  this->len = this->len + 1;
  this->cap = uVar3;
  this->data_ = __result;
  return this_00;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}